

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O1

void slang::lshrFar(uint64_t *dst,uint64_t *src,uint32_t wordShift,uint32_t offset,uint32_t start,
                   uint32_t numWords)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = numWords + start;
  if (wordShift == 0) {
    if (start < iVar4 - offset) {
      uVar3 = (ulong)start;
      do {
        dst[uVar3] = src[offset + (int)uVar3];
        uVar3 = uVar3 + 1;
      } while (iVar4 - offset != uVar3);
    }
    return;
  }
  uVar2 = ~offset + iVar4;
  bVar1 = (byte)wordShift;
  if (start < uVar2) {
    uVar3 = (ulong)start;
    do {
      dst[uVar3] = src[offset + 1 + (int)uVar3] << (0x40 - bVar1 & 0x3f) |
                   src[offset + (int)uVar3] >> (bVar1 & 0x3f);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  dst[uVar2] = src[iVar4 - 1] >> (bVar1 & 0x3f);
  return;
}

Assistant:

static void lshrFar(uint64_t* dst, uint64_t* src, uint32_t wordShift, uint32_t offset,
                    uint32_t start, uint32_t numWords) {
    // this function is split out so that if we have an unknown value we can reuse the code
    // optimization: move whole words
    if (wordShift == 0) {
        for (uint32_t i = start; i < start + numWords - offset; i++)
            dst[i] = src[i + offset];
    }
    else {
        // shift low order words
        uint32_t breakWord = start + numWords - offset - 1;
        for (uint32_t i = start; i < breakWord; i++) {
            dst[i] = (src[i + offset] >> wordShift) |
                     (src[i + offset + 1] << (SVInt::BITS_PER_WORD - wordShift));
        }

        // shift the "break" word
        dst[breakWord] = src[breakWord + offset] >> wordShift;
    }
}